

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O1

int __thiscall ktx::CommandExtract::OptionsExtract::init(OptionsExtract *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  OptionAdder *pOVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  allocator<char> local_592;
  allocator<char> local_591;
  allocator<char> local_590;
  allocator<char> local_58f;
  allocator<char> local_58e;
  allocator<char> local_58d;
  allocator<char> local_58c;
  allocator<char> local_58b;
  allocator<char> local_58a;
  allocator<char> local_589;
  string local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_568;
  size_type local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  element_type *local_548;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_540;
  element_type *local_538;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_530;
  element_type *local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_520;
  element_type *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_510;
  element_type *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_500;
  element_type *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f0;
  element_type *local_4e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4e0;
  element_type *local_4d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4d0;
  element_type *local_4c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4c0;
  element_type *local_4b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4b0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  OptionAdder local_2c0;
  shared_ptr<const_cxxopts::Value> local_298;
  shared_ptr<const_cxxopts::Value> local_288;
  shared_ptr<const_cxxopts::Value> local_278;
  shared_ptr<const_cxxopts::Value> local_268;
  shared_ptr<const_cxxopts::Value> local_258;
  shared_ptr<const_cxxopts::Value> local_248;
  shared_ptr<const_cxxopts::Value> local_238;
  shared_ptr<const_cxxopts::Value> local_228;
  shared_ptr<const_cxxopts::Value> local_218;
  shared_ptr<const_cxxopts::Value> local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_568 = &local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"");
  local_2c0.m_group._M_string_length = local_560;
  if (local_568 == &local_558) {
    local_588.field_2._8_8_ = local_558._8_8_;
    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  }
  else {
    local_588._M_dataplus._M_p = (pointer)local_568;
  }
  local_588.field_2._M_allocated_capacity._1_7_ = local_558._M_allocated_capacity._1_7_;
  local_588.field_2._M_local_buf[0] = local_558._M_local_buf[0];
  local_588._M_string_length = local_560;
  local_560 = 0;
  local_558._M_local_buf[0] = '\0';
  local_2c0.m_group._M_dataplus._M_p = (pointer)&local_2c0.m_group.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p == &local_588.field_2) {
    local_2c0.m_group.field_2._8_8_ = local_588.field_2._8_8_;
  }
  else {
    local_2c0.m_group._M_dataplus._M_p = local_588._M_dataplus._M_p;
  }
  local_2c0.m_group.field_2._M_allocated_capacity = local_588.field_2._M_allocated_capacity;
  local_568 = &local_558;
  local_2c0.m_options = (Options *)ctx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,kOutput,&local_589);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "Output filepath for single, output directory for multiple image export.","");
  cxxopts::value<std::__cxx11::string>();
  local_208.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4b8;
  local_208.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_4b0;
  local_4b8 = (element_type *)0x0;
  p_Stack_4b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"<filepath>","");
  pOVar2 = cxxopts::OptionAdder::operator()(&local_2c0,&local_588,&local_2e0,&local_208,&local_300);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,kStdout,&local_58a);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "Use stdout as the output file. (Using a single dash \'-\' as the output file has the same effect)"
             ,"");
  cxxopts::value<bool>();
  local_218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4c8;
  local_218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_4c0;
  local_4c8 = (element_type *)0x0;
  p_Stack_4c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_50,&local_320,&local_218,&local_340);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,kTranscode,&local_58b);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_360,
             "Transcode the texture to the target format before executing the extract steps. Requires the input file to be transcodable. Block compressed transcode targets can only be saved in raw format. Case-insensitive.\nPossible options are: etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc | r8 | rg8 | rgb8 | rgba8.\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2."
             ,"");
  cxxopts::value<std::__cxx11::string>();
  local_228.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4d8;
  local_228.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_4d0;
  local_4d8 = (element_type *)0x0;
  p_Stack_4d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"<target>","");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_70,&local_360,&local_228,&local_380);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,kUri,&local_58c);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"KTX Fragment URI.","");
  cxxopts::value<std::__cxx11::string>();
  local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4e8;
  local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_4e0;
  local_4e8 = (element_type *)0x0;
  p_Stack_4e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"<uri>","");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_90,&local_3a0,&local_238,&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,kLevel,&local_58d);
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,
             "Level to extract. When \'all\' is used every level is exported. Defaults to 0.","");
  cxxopts::value<std::__cxx11::string>();
  local_248.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4f8;
  local_248.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_4f0;
  local_4f8 = (element_type *)0x0;
  p_Stack_4f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"[0-9]+ | all","");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_b0,&local_3e0,&local_248,&local_400);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,kLayer,&local_58e);
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_420,
             "Layer to extract. When \'all\' is used every layer is exported. Defaults to 0.","");
  cxxopts::value<std::__cxx11::string>();
  local_258.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_508;
  local_258.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_500;
  local_508 = (element_type *)0x0;
  p_Stack_500 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"[0-9]+ | all","");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_d0,&local_420,&local_258,&local_440);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,kFace,&local_58f);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,
             "Face to extract. When \'all\' is used every face is exported. Defaults to 0.","");
  cxxopts::value<std::__cxx11::string>();
  local_268.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_518;
  local_268.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_510;
  local_518 = (element_type *)0x0;
  p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"[0-5] | all","");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_f0,&local_460,&local_268,&local_480);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,kDepth,&local_590);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a0,
             "Depth slice to extract. When \'all\' is used every depth is exported. Defaults to 0.",
             "");
  cxxopts::value<std::__cxx11::string>();
  local_278.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_528;
  local_278.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_520;
  local_528 = (element_type *)0x0;
  p_Stack_520 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"[0-9]+ | all","");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_110,&local_4a0,&local_278,&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,kAll,&local_591);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Extract every image slice from the texture.","");
  cxxopts::value<bool>();
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_538;
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_530;
  local_538 = (element_type *)0x0;
  p_Stack_530 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_130,&local_190,&local_288,&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,kRaw,&local_592);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"Extract the raw image data without any conversion.","");
  cxxopts::value<bool>();
  local_298.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_548;
  local_298.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_540;
  local_548 = (element_type *)0x0;
  p_Stack_540 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  cxxopts::OptionAdder::operator()(pOVar2,&local_150,&local_1d0,&local_298,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_298.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_540 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_540);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_530);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_278.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_520);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if (local_268.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_510);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if (local_258.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_500 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_500);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if (local_248.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if (local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_228.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_4d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if (local_218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_4c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_208.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_4b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_588.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar3) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    paVar3 = extraout_RAX;
  }
  iVar1 = (int)paVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.m_group._M_dataplus._M_p != &local_2c0.m_group.field_2) {
    operator_delete(local_2c0.m_group._M_dataplus._M_p,
                    local_2c0.m_group.field_2._M_allocated_capacity + 1);
    iVar1 = extraout_EAX;
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,
                    CONCAT71(local_558._M_allocated_capacity._1_7_,local_558._M_local_buf[0]) + 1);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void CommandExtract::OptionsExtract::init(cxxopts::Options& opts) {
    opts.add_options()
            (kOutput, "Output filepath for single, output directory for multiple image export.", cxxopts::value<std::string>(), "<filepath>")
            (kStdout, "Use stdout as the output file. (Using a single dash '-' as the output file has the same effect)")
            (kTranscode, "Transcode the texture to the target format before executing the extract steps."
                          " Requires the input file to be transcodable."
                          " Block compressed transcode targets can only be saved in raw format."
                          " Case-insensitive."
                          "\nPossible options are:"
                          " etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc |"
                          " r8 | rg8 | rgb8 | rgba8."
                          "\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2.",
                          cxxopts::value<std::string>(), "<target>")
            (kUri, "KTX Fragment URI.", cxxopts::value<std::string>(), "<uri>")
            (kLevel, "Level to extract. When 'all' is used every level is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kLayer, "Layer to extract. When 'all' is used every layer is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kFace, "Face to extract. When 'all' is used every face is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-5] | all")
            (kDepth, "Depth slice to extract. When 'all' is used every depth is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kAll, "Extract every image slice from the texture.")
            (kRaw, "Extract the raw image data without any conversion.");
}